

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

bool Js::JavascriptArray::CopyNativeFloatArrayElements
               (JavascriptNativeFloatArray *dstArray,uint32 dstIndex,
               JavascriptNativeFloatArray *srcArray,uint32 start,uint32 end)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint32 count;
  double newValue;
  undefined1 local_48 [8];
  ArrayElementEnumerator e;
  
  uVar5 = (srcArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length;
  if (uVar5 < end) {
    end = uVar5;
  }
  if (start < end) {
    if (CARRY4(end - start,dstIndex)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2d2b,"(end - start <= MaxArrayLength - dstIndex)",
                                  "end - start <= MaxArrayLength - dstIndex");
      if (!bVar2) goto LAB_00b822cb;
      *puVar4 = 0;
    }
    if ((srcArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length < end
       ) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2d2c,"(start < end && end <= srcArray->length)",
                                  "start < end && end <= srcArray->length");
      if (!bVar2) {
LAB_00b822cb:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    ArrayElementEnumerator::ArrayElementEnumerator
              ((ArrayElementEnumerator *)local_48,(JavascriptArray *)srcArray,start,end);
    if (local_48 == (undefined1  [8])0x0) {
      count = 0;
    }
    else {
      count = 0;
      uVar5 = e.seg._4_4_;
      do {
        uVar7 = (ulong)(uint)e.seg;
        uVar6 = (uint)e.seg + 1;
        if ((uint)e.seg + 1 < uVar5) {
          uVar6 = uVar5;
        }
        do {
          if (uVar6 - 1 == (int)uVar7) {
            local_48 = (undefined1  [8])((Type *)((long)local_48 + 0x10))->ptr;
            e.seg._0_4_ = uVar6;
            if (local_48 == (undefined1  [8])0x0) goto joined_r0x00b82268;
            uVar6 = e.endIndex - ((SparseArraySegmentBase *)local_48)->left;
            if (((SparseArraySegmentBase *)local_48)->left <= e.endIndex && uVar6 != 0) {
              e.seg._0_4_ = 0xffffffff;
              uVar5 = ((SparseArraySegmentBase *)local_48)->length;
              e.seg._4_4_ = uVar5;
              if (uVar6 < uVar5) {
                uVar5 = uVar6;
                e.seg._4_4_ = uVar6;
              }
              goto joined_r0x00b82268;
            }
            local_48 = (undefined1  [8])0x0;
            goto LAB_00b82282;
          }
          e.seg._0_4_ = (int)uVar7 + 1;
          uVar7 = (ulong)(uint)e.seg;
        } while (*(undefined1 **)
                  (&((SparseArraySegmentBase *)((long)local_48 + 0x18))->left + uVar7 * 2) ==
                 &DAT_fff80002fff80002);
        uVar3 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_48);
        newValue = ArrayElementEnumerator::GetItem<double>((ArrayElementEnumerator *)local_48);
        DirectSetItemAt<double>((JavascriptArray *)dstArray,uVar3 + (dstIndex - start),newValue);
        count = count + 1;
        uVar5 = e.seg._4_4_;
joined_r0x00b82268:
      } while (local_48 != (undefined1  [8])0x0);
    }
LAB_00b82282:
    bVar2 = count + start != end;
    if (bVar2) {
      JavascriptNativeFloatArray::ToVarArray(dstArray);
      InternalFillFromPrototype
                ((JavascriptArray *)dstArray,dstIndex,(JavascriptArray *)srcArray,start,end,count);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool JavascriptArray::CopyNativeFloatArrayElements(JavascriptNativeFloatArray* dstArray, uint32 dstIndex, JavascriptNativeFloatArray* srcArray, uint32 start, uint32 end)
    {
        end = min(end, srcArray->length);
        if (start >= end)
        {
            return false;
        }

        Assert(end - start <= MaxArrayLength - dstIndex);
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<double>())
        {
            uint n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, e.GetItem<double>());
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            JavascriptArray *varArray = JavascriptNativeFloatArray::ToVarArray(dstArray);
            InternalFillFromPrototype(varArray, dstIndex, srcArray, start, end, count);
            return true;
        }

        return false;
    }